

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void instruct_totype(Proc *proc,Pseudo *target,VariableType *vtype,uint line_number)

{
  ravitype_t rVar1;
  Instruction *insn_00;
  Constant *constant;
  Pseudo *pseudo;
  Pseudo *tname_pseudo;
  Constant *tname_constant;
  Instruction *insn;
  opcode targetop;
  uint line_number_local;
  VariableType *vtype_local;
  Pseudo *target_local;
  Proc *proc_local;
  
  rVar1 = vtype->type_code;
  if (rVar1 == RAVI_TNUMINT) {
    insn._0_4_ = op_toint;
  }
  else if (rVar1 == RAVI_TNUMFLT) {
    insn._0_4_ = op_toflt;
  }
  else if (rVar1 == RAVI_TARRAYINT) {
    insn._0_4_ = op_toiarray;
  }
  else if (rVar1 == RAVI_TARRAYFLT) {
    insn._0_4_ = op_tofarray;
  }
  else if (rVar1 == RAVI_TTABLE) {
    insn._0_4_ = op_totable;
  }
  else if (rVar1 == RAVI_TSTRING) {
    insn._0_4_ = op_tostring;
  }
  else if (rVar1 == RAVI_TFUNCTION) {
    insn._0_4_ = op_toclosure;
  }
  else {
    if (rVar1 != RAVI_TUSERDATA) {
      return;
    }
    insn._0_4_ = op_totype;
  }
  insn_00 = allocate_instruction(proc,(opcode)insn,line_number);
  if ((opcode)insn == op_totype) {
    if (vtype->type_name == (StringObject *)0x0) {
      __assert_fail("vtype->type_name",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x2c9,
                    "void instruct_totype(Proc *, Pseudo *, const VariableType *, unsigned int)");
    }
    constant = allocate_string_constant(proc,vtype->type_name);
    pseudo = allocate_constant_pseudo(proc,constant);
    add_instruction_operand(proc,insn_00,pseudo);
  }
  add_instruction_target(proc,insn_00,target);
  add_instruction(proc,insn_00);
  return;
}

Assistant:

static void instruct_totype(Proc *proc, Pseudo *target, const VariableType *vtype, unsigned line_number)
{
	enum opcode targetop = op_nop;
	switch (vtype->type_code) {
	case RAVI_TNUMFLT:
		targetop = op_toflt;
		break;
	case RAVI_TNUMINT:
		targetop = op_toint;
		break;
	case RAVI_TSTRING:
		targetop = op_tostring;
		break;
	case RAVI_TFUNCTION:
		targetop = op_toclosure;
		break;
	case RAVI_TTABLE:
		targetop = op_totable;
		break;
	case RAVI_TARRAYFLT:
		targetop = op_tofarray;
		break;
	case RAVI_TARRAYINT:
		targetop = op_toiarray;
		break;
	case RAVI_TUSERDATA:
		targetop = op_totype;
		break;
	default:
		return;
	}
	Instruction *insn = allocate_instruction(proc, targetop, line_number);
	if (targetop == op_totype) {
		assert(vtype->type_name);
		const Constant *tname_constant = allocate_string_constant(proc, vtype->type_name);
		Pseudo *tname_pseudo = allocate_constant_pseudo(proc, tname_constant);
		add_instruction_operand(proc, insn, tname_pseudo);
	}
	add_instruction_target(proc, insn, target);
	add_instruction(proc, insn);
}